

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall
QWidgetTextControl::setExtraSelections
          (QWidgetTextControl *this,QList<QTextEdit::ExtraSelection> *selections)

{
  QList<QAbstractTextDocumentLayout::Selection> *this_00;
  int iVar1;
  ExtraSelection *pEVar2;
  long lVar3;
  const_iterator it;
  ulong uVar4;
  char cVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  pointer pSVar10;
  long lVar11;
  ulong uVar12;
  Data *pDVar13;
  uchar *puVar14;
  long in_FS_OFFSET;
  QRectF local_98;
  QMultiHash<int,_int> local_78;
  const_iterator local_68;
  void *local_48;
  QRectF *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar11 = *(long *)(this + 8);
  local_78.d = (Data *)0x0;
  local_78.m_size = 0;
  local_48 = (void *)((ulong)local_48 & 0xffffffff00000000);
  if (*(long *)(lVar11 + 0x130) != 0) {
    do {
      uVar6 = QTextCursor::anchor();
      local_68.i.d = (Data<QHashPrivate::MultiNode<int,_int>_> *)CONCAT44(local_68.i.d._4_4_,uVar6);
      QMultiHash<int,int>::emplace<int_const&>
                ((iterator *)&local_98,&local_78,(int *)&local_68,(int *)&local_48);
      lVar9 = (long)(int)local_48;
      local_48 = (void *)CONCAT44(local_48._4_4_,(int)(lVar9 + 1));
    } while (lVar9 + 1 < *(long *)(lVar11 + 0x130));
  }
  if ((selections->d).size != 0) {
    lVar9 = 0;
    uVar12 = 0;
    do {
      pEVar2 = (selections->d).ptr;
      local_68.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
      local_68.i.d = (Data<QHashPrivate::MultiNode<int,_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      uVar6 = QTextCursor::anchor();
      local_98.xp = (qreal)CONCAT44(local_98.xp._4_4_,uVar6);
      QMultiHash<int,_int>::constFindImpl<int>(&local_68,&local_78,(int *)&local_98);
      if (local_68.e == (Chain **)0x0) {
LAB_004cf159:
        local_98.w = -NAN;
        local_98.h._0_4_ = 0xffffffff;
        local_98.h._4_4_ = 0xffffffff;
        local_98.xp = -NAN;
        local_98.yp._0_4_ = 0xffffffff;
        local_98.yp._4_4_ = 0xffffffff;
        selectionRect(&local_98,this,&pEVar2->cursor + lVar9);
        cVar5 = QTextFormat::boolProperty((int)pEVar2 + (int)lVar9 + 8);
        if (cVar5 != '\0') {
          local_98.xp = (0.0 - local_98.xp) + local_98.xp;
          local_98.w = 2147483647.0;
        }
        local_48 = (void *)0x0;
        pQStack_40 = &local_98;
        QMetaObject::activate((QObject *)this,&staticMetaObject,7,&local_48);
      }
      else {
        iVar1 = (*local_68.e)->value;
        lVar3 = *(long *)(lVar11 + 0x128);
        iVar7 = QTextCursor::position();
        iVar8 = QTextCursor::position();
        if ((iVar7 != iVar8) ||
           (cVar5 = QTextFormat::operator==
                              ((QTextFormat *)((long)iVar1 * 0x18 + lVar3 + 8),
                               &(pEVar2->format).super_QTextFormat + lVar9), cVar5 == '\0'))
        goto LAB_004cf159;
        it.i.bucket = local_68.i.bucket;
        it.i.d = local_68.i.d;
        it.e = local_68.e;
        QMultiHash<int,_int>::erase((iterator *)&local_98,&local_78,it);
      }
      uVar12 = uVar12 + 1;
      lVar9 = lVar9 + 0x18;
    } while (uVar12 < (ulong)(selections->d).size);
  }
  if (local_78.d == (Data *)0x0) {
    uVar12 = 0;
    puVar14 = (uchar *)0x0;
    pDVar13 = (Data *)0x0;
  }
  else {
    pDVar13 = local_78.d;
    if ((local_78.d)->spans->offsets[0] == 0xff) {
      uVar4 = 1;
      do {
        uVar12 = uVar4;
        if ((local_78.d)->numBuckets == uVar12) {
          uVar12 = 0;
          pDVar13 = (Data *)0x0;
          break;
        }
        uVar4 = uVar12 + 1;
      } while ((local_78.d)->spans[uVar12 >> 7].offsets[(uint)uVar12 & 0x7f] == 0xff);
    }
    else {
      uVar12 = 0;
    }
    if (pDVar13 == (Data *)0x0) {
      puVar14 = (uchar *)0x0;
    }
    else {
      puVar14 = pDVar13->spans[uVar12 >> 7].entries
                [pDVar13->spans[uVar12 >> 7].offsets[(uint)uVar12 & 0x7f]].storage.data + 8;
    }
  }
  this_00 = (QList<QAbstractTextDocumentLayout::Selection> *)(lVar11 + 0x120);
  do {
    while( true ) {
      if (puVar14 == (uchar *)0x0) {
        QList<QAbstractTextDocumentLayout::Selection>::resize(this_00,(selections->d).size);
        if ((selections->d).size != 0) {
          lVar11 = 8;
          uVar12 = 0;
          do {
            pEVar2 = (selections->d).ptr;
            pSVar10 = QList<QAbstractTextDocumentLayout::Selection>::data(this_00);
            QTextCursor::operator=
                      ((QTextCursor *)((long)pSVar10 + lVar11 + -8),
                       (QTextCursor *)((long)pEVar2 + lVar11 + -8));
            pEVar2 = (selections->d).ptr;
            pSVar10 = QList<QAbstractTextDocumentLayout::Selection>::data(this_00);
            QTextFormat::operator=
                      ((QTextFormat *)(&pSVar10->cursor + lVar11),
                       (QTextFormat *)(&pEVar2->cursor + lVar11));
            uVar12 = uVar12 + 1;
            lVar11 = lVar11 + 0x18;
          } while (uVar12 < (ulong)(selections->d).size);
        }
        QMultiHash<int,_int>::~QMultiHash(&local_78);
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return;
      }
      iVar1 = **(int **)puVar14;
      lVar9 = *(long *)(lVar11 + 0x128);
      local_98.w = -NAN;
      local_98.h._0_4_ = 0xffffffff;
      local_98.h._4_4_ = 0xffffffff;
      local_98.xp = -NAN;
      local_98.yp._0_4_ = 0xffffffff;
      local_98.yp._4_4_ = 0xffffffff;
      selectionRect(&local_98,this,(QTextCursor *)(lVar9 + (long)iVar1 * 0x18));
      cVar5 = QTextFormat::boolProperty((int)lVar9 + iVar1 * 0x18 + 8);
      if (cVar5 != '\0') {
        local_98.xp = (0.0 - local_98.xp) + local_98.xp;
        local_98.w = 2147483647.0;
      }
      local_68.i.d = (Data<QHashPrivate::MultiNode<int,_int>_> *)0x0;
      local_68.i.bucket = (size_t)&local_98;
      QMetaObject::activate((QObject *)this,&staticMetaObject,7,(void **)&local_68);
      if (*(long *)(*(long *)puVar14 + 8) == 0) break;
      puVar14 = (uchar *)(*(long *)puVar14 + 8);
    }
    do {
      if (pDVar13->numBuckets - 1 == uVar12) {
        uVar12 = 0;
        pDVar13 = (Data *)0x0;
        break;
      }
      uVar12 = uVar12 + 1;
    } while (pDVar13->spans[uVar12 >> 7].offsets[(uint)uVar12 & 0x7f] == 0xff);
    if (pDVar13 == (Data *)0x0) {
      puVar14 = (uchar *)0x0;
    }
    else {
      puVar14 = pDVar13->spans[uVar12 >> 7].entries
                [pDVar13->spans[uVar12 >> 7].offsets[(uint)uVar12 & 0x7f]].storage.data + 8;
    }
  } while( true );
}

Assistant:

void QWidgetTextControl::setExtraSelections(const QList<QTextEdit::ExtraSelection> &selections)
{
    Q_D(QWidgetTextControl);

    QMultiHash<int, int> hash;
    for (int i = 0; i < d->extraSelections.size(); ++i) {
        const QAbstractTextDocumentLayout::Selection &esel = d->extraSelections.at(i);
        hash.insert(esel.cursor.anchor(), i);
    }

    for (int i = 0; i < selections.size(); ++i) {
        const QTextEdit::ExtraSelection &sel = selections.at(i);
        const auto it = hash.constFind(sel.cursor.anchor());
        if (it != hash.cend()) {
            const QAbstractTextDocumentLayout::Selection &esel = d->extraSelections.at(it.value());
            if (esel.cursor.position() == sel.cursor.position()
                && esel.format == sel.format) {
                hash.erase(it);
                continue;
            }
        }
        QRectF r = selectionRect(sel.cursor);
        if (sel.format.boolProperty(QTextFormat::FullWidthSelection)) {
            r.setLeft(0);
            r.setWidth(qreal(INT_MAX));
        }
        emit updateRequest(r);
    }

    for (auto it = hash.cbegin(); it != hash.cend(); ++it) {
        const QAbstractTextDocumentLayout::Selection &esel = d->extraSelections.at(it.value());
        QRectF r = selectionRect(esel.cursor);
        if (esel.format.boolProperty(QTextFormat::FullWidthSelection)) {
            r.setLeft(0);
            r.setWidth(qreal(INT_MAX));
        }
        emit updateRequest(r);
    }

    d->extraSelections.resize(selections.size());
    for (int i = 0; i < selections.size(); ++i) {
        d->extraSelections[i].cursor = selections.at(i).cursor;
        d->extraSelections[i].format = selections.at(i).format;
    }
}